

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve
          (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this,size_t n)

{
  float *pfVar1;
  iterator pfVar2;
  ulong in_RSI;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  int i;
  float *ra;
  float *in_stack_ffffffffffffffc8;
  polymorphic_allocator<float> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    pfVar1 = pmr::polymorphic_allocator<float>::allocate_object<float>
                       (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = (polymorphic_allocator<float> *)(pfVar1 + local_1c);
      pfVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<float>::construct<float,float>
                (&in_RDI->alloc,(float *)in_stack_ffffffffffffffd0,pfVar2 + local_1c);
      pfVar2 = begin(in_RDI);
      pmr::polymorphic_allocator<float>::destroy<float>(&in_RDI->alloc,pfVar2 + local_1c);
    }
    pmr::polymorphic_allocator<float>::deallocate_object<float>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x3febf4);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pfVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }